

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall plot::BrailleCanvas::push(BrailleCanvas *this)

{
  bool bVar1;
  vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_> *__x;
  iterator local_40;
  const_iterator local_38;
  iterator local_30;
  const_iterator local_28;
  Size local_20;
  BrailleCanvas *local_10;
  BrailleCanvas *this_local;
  
  local_10 = this;
  bVar1 = std::
          forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
          ::empty(&this->available_layers_);
  if (bVar1) {
    local_20 = char_size(this);
    std::forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
    ::emplace_front<plot::GenericPoint<long>>
              ((forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
                *)&this->available_layers_,&local_20);
  }
  local_30._M_node =
       (_Fwd_list_node_base *)
       std::
       forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
       ::before_begin(&this->stack_);
  std::_Fwd_list_const_iterator<plot::detail::braille::image_t>::_Fwd_list_const_iterator
            (&local_28,&local_30);
  local_40._M_node =
       (_Fwd_list_node_base *)
       std::
       forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
       ::before_begin(&this->available_layers_);
  std::_Fwd_list_const_iterator<plot::detail::braille::image_t>::_Fwd_list_const_iterator
            (&local_38,&local_40);
  std::forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ::splice_after(&this->stack_,local_28,&this->available_layers_,local_38);
  __x = &std::
         forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
         ::front(&this->stack_)->
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ;
  std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::swap
            (&(this->blocks_).
              super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ,__x);
  detail::braille::image_t::clear(&this->blocks_);
  return this;
}

Assistant:

BrailleCanvas& push() {
        if (available_layers_.empty())
            available_layers_.emplace_front(char_size());

        stack_.splice_after(stack_.before_begin(), available_layers_, available_layers_.before_begin());
        blocks_.swap(stack_.front());
        blocks_.clear();
        return *this;
    }